

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

void __thiscall
MPL::detail::ModelPackageImpl::ModelPackageImpl
          (ModelPackageImpl *this,path *path,bool createIfNecessary,bool readOnly)

{
  path *__return_storage_ptr__;
  path *__return_storage_ptr___00;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *this_00;
  JsonMap *this_01;
  _Alloc_hider _Var1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  allocator<char> local_279;
  string local_278;
  string local_258;
  ifstream manifestStream;
  ostream local_228 [504];
  
  std::filesystem::__cxx11::path::path(&this->m_packagePath,path);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&manifestStream,&kModelPackageManifestFileName,auto_format);
  __return_storage_ptr__ = &this->m_manifestPath;
  std::filesystem::__cxx11::operator/(__return_storage_ptr__,path,(path *)&manifestStream);
  std::filesystem::__cxx11::path::~path((path *)&manifestStream);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&manifestStream,&kModelPackageDataDir,auto_format);
  __return_storage_ptr___00 = &this->m_packageDataDirPath;
  std::filesystem::__cxx11::operator/(__return_storage_ptr___00,path,(path *)&manifestStream);
  std::filesystem::__cxx11::path::~path((path *)&manifestStream);
  this_00 = &this->m_manifest;
  (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
  super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
  super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl = (JsonMap *)0x0;
  this->m_readOnly = readOnly;
  bVar2 = std::filesystem::exists(&this->m_packagePath);
  if (bVar2) {
    bVar2 = std::filesystem::exists(__return_storage_ptr__);
    if (!bVar2) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::filesystem::__cxx11::path::string(&local_278,__return_storage_ptr__);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &manifestStream,"A valid manifest does not exist at path: ",&local_278);
      std::runtime_error::runtime_error(prVar5,(string *)&manifestStream);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
              ((ifstream *)&manifestStream,__return_storage_ptr__,_S_bin);
    std::make_unique<JsonMap,std::ifstream&>
              ((basic_ifstream<char,_std::char_traits<char>_> *)&local_278);
    _Var1._M_p = local_278._M_dataplus._M_p;
    local_278._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>::reset
              ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_> *)this_00,
               (pointer)_Var1._M_p);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)&local_278);
    std::ifstream::close();
    std::ifstream::~ifstream(&manifestStream);
  }
  else {
    if (!createIfNecessary) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::filesystem::__cxx11::path::string(&local_278,&this->m_packagePath);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &manifestStream,"Failed to open model package at path: ",&local_278);
      std::runtime_error::runtime_error(prVar5,(string *)&manifestStream);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar3 = std::filesystem::create_directory(&this->m_packagePath);
    if (cVar3 == '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::filesystem::__cxx11::path::string(&local_278,&this->m_packagePath);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &manifestStream,"Failed to create model package at path: ",&local_278);
      std::runtime_error::runtime_error(prVar5,(string *)&manifestStream);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar3 = std::filesystem::create_directory(__return_storage_ptr___00);
    if (cVar3 == '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::filesystem::__cxx11::path::string(&local_278,__return_storage_ptr___00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &manifestStream,"Failed to create data directory at path: ",&local_278);
      std::runtime_error::runtime_error(prVar5,(string *)&manifestStream);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::make_unique<JsonMap>();
    _Var1._M_p = _manifestStream;
    _manifestStream = (pointer)0x0;
    std::__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>::reset
              ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_> *)this_00,
               (pointer)_Var1._M_p);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)&manifestStream);
    std::__cxx11::stringstream::stringstream((stringstream *)&manifestStream);
    poVar4 = (ostream *)std::ostream::operator<<(local_228,1);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    poVar4 = std::operator<<(poVar4,".");
    std::ostream::operator<<((ostream *)poVar4,0);
    this_01 = (this_00->_M_t).super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
              super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
              super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"fileFormatVersion",&local_279);
    std::__cxx11::stringbuf::str();
    JsonMap::setString(this_01,&local_278,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::stringstream::~stringstream((stringstream *)&manifestStream);
  }
  validate(this);
  return;
}

Assistant:

ModelPackageImpl::ModelPackageImpl(const std::filesystem::path& path, bool createIfNecessary, bool readOnly)
: m_packagePath(path),
  m_manifestPath(path / kModelPackageManifestFileName),
  m_packageDataDirPath(path / kModelPackageDataDir),
  m_manifest(nullptr),
  m_readOnly(readOnly)
{
    if (std::filesystem::exists(m_packagePath)) {
        if (std::filesystem::exists(m_manifestPath)) {
            std::ifstream manifestStream(m_manifestPath, std::ios::binary);
            m_manifest = std::make_unique<JsonMap>(manifestStream);
            manifestStream.close();
        } else {
            throw std::runtime_error("A valid manifest does not exist at path: " + m_manifestPath.string());
        }
    }
    // Create the package structure at specified path
    else if (createIfNecessary) {
        if (false == create_directory(m_packagePath)) {
            throw std::runtime_error("Failed to create model package at path: " + m_packagePath.string());
        }
        
        if (false == create_directory(m_packageDataDirPath)) {
            throw std::runtime_error("Failed to create data directory at path: " + m_packageDataDirPath.string());
        }
        
        m_manifest = std::make_unique<JsonMap>();
        std::stringstream ss;
        ss << kModelPackageFileFormatMajorVersion << "." << kModelPackageFileFormatMinorVersion << "." << kModelPackageFileFormatPatchVersion;
        m_manifest->setString(kModelPackageFileFormatVersionKey, ss.str());
    }
    // Error out since package does not exist
    else {
        throw std::runtime_error("Failed to open model package at path: " + m_packagePath.string());
    }
    
    validate();
}